

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

void __thiscall
dynet::RMSPropTrainer::update_lookup_params(RMSPropTrainer *this,real gscale,size_t idx,size_t lidx)

{
  LookupParameterStorage *pLVar1;
  ParameterCollectionStorage *pPVar2;
  initializer_list<dynet::Tensor_*> __l;
  allocator_type local_4d;
  real local_4c;
  _Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> local_48;
  Tensor *local_30;
  long local_28;
  long local_20;
  
  local_4c = gscale;
  pPVar2 = ParameterCollection::get_storage((this->super_Trainer).model);
  pLVar1 = (pPVar2->lookup_params).
           super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
           ._M_impl.super__Vector_impl_data._M_start[idx];
  local_20 = lidx * 0x40;
  local_30 = (Tensor *)
             (*(long *)&(pLVar1->values).
                        super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
                        super__Vector_impl_data + local_20);
  local_28 = *(long *)&(pLVar1->grads).
                       super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
                       super__Vector_impl_data + local_20;
  local_20 = local_20 +
             *(long *)&(this->hlmsg).
                       super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
                       ._M_impl.super__Vector_impl_data._M_start[idx].h.
                       super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl;
  __l._M_len = 3;
  __l._M_array = &local_30;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector
            ((vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)&local_48,__l,&local_4d);
  (*(this->super_Trainer)._vptr_Trainer[5])(local_4c,this,&local_48);
  std::_Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void RMSPropTrainer::update_lookup_params(real gscale, size_t idx, size_t lidx) {
  auto & p = model->lookup_parameters_list()[idx];
  update_rule(gscale, {&p->values[lidx], &p->grads[lidx], &hlmsg[idx].h[lidx]});
}